

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

Result * CoreML::Model::enforceTypeInvariant
                   (Result *__return_storage_ptr__,
                   vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>
                   *allowedFeatureTypes,FeatureType *featureType)

{
  FeatureType *pFVar1;
  bool bVar2;
  FeatureType *other;
  vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_> *__range1;
  bool bVar3;
  
  other = (allowedFeatureTypes->
          super__Vector_base<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>)._M_impl.
          super__Vector_impl_data._M_start;
  pFVar1 = (allowedFeatureTypes->
           super__Vector_base<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  bVar3 = other == pFVar1;
  if (!bVar3) {
    bVar2 = FeatureType::operator==(featureType,other);
    while (!bVar2) {
      other = other + 1;
      bVar3 = other == pFVar1;
      if (bVar3) goto LAB_00286acc;
      bVar2 = FeatureType::operator==(featureType,other);
    }
    Result::Result(__return_storage_ptr__);
    if (!bVar3) {
      return __return_storage_ptr__;
    }
  }
LAB_00286acc:
  Result::featureTypeInvariantError(__return_storage_ptr__,allowedFeatureTypes,featureType);
  return __return_storage_ptr__;
}

Assistant:

Result Model::enforceTypeInvariant(const std::vector<FeatureType>& allowedFeatureTypes,
                                       FeatureType featureType) {
        
        for (const FeatureType& t : allowedFeatureTypes) {
            if (featureType == t) {
                // no invariant broken -- type matches one of the allowed types
                return Result();
            }
        }
        
        return Result::featureTypeInvariantError(allowedFeatureTypes, featureType);
    }